

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
* mocker::findRedundantNodes
            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             *__return_storage_ptr__,shared_ptr<mocker::ast::ASTNode> *ast,
            unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Type>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>_>
            *exprType,
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *pureFunc)

{
  element_type *peVar1;
  FindRedundantNodes local_b0;
  undefined1 local_29;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pureFunc_local;
  unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Type>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>_>
  *exprType_local;
  shared_ptr<mocker::ast::ASTNode> *ast_local;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *res;
  
  local_29 = 0;
  local_28 = pureFunc;
  pureFunc_local =
       (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)exprType;
  exprType_local =
       (unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Type>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>_>
        *)ast;
  ast_local = (shared_ptr<mocker::ast::ASTNode> *)__return_storage_ptr__;
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set(__return_storage_ptr__);
  peVar1 = std::__shared_ptr_access<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)exprType_local);
  anon_unknown_6::FindRedundantNodes::FindRedundantNodes
            (&local_b0,__return_storage_ptr__,
             (unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Type>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>_>
              *)pureFunc_local,local_28);
  (*peVar1->_vptr_ASTNode[3])(peVar1,&local_b0);
  anon_unknown_6::FindRedundantNodes::~FindRedundantNodes(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<ast::NodeID> findRedundantNodes(
    const std::shared_ptr<ast::ASTNode> &ast,
    const std::unordered_map<ast::NodeID, std::shared_ptr<ast::Type>> &exprType,
    const std::unordered_set<std::string> &pureFunc) {
  std::unordered_set<ast::NodeID> res;
  ast->accept(FindRedundantNodes{res, exprType, pureFunc});
  return res;
}